

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpAggregator.cpp
# Opt level: O0

void __thiscall
HighsLpAggregator::HighsLpAggregator(HighsLpAggregator *this,HighsLpRelaxation *lprelaxation)

{
  HighsLp *pHVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  HighsInt dimension;
  HighsSparseVectorSum *in_stack_ffffffffffffffc0;
  
  *in_RDI = in_RSI;
  HighsSparseVectorSum::HighsSparseVectorSum(in_stack_ffffffffffffffc0);
  pHVar1 = HighsLpRelaxation::getLp((HighsLpRelaxation *)0x601d0b);
  dimension = pHVar1->num_row_;
  pHVar1 = HighsLpRelaxation::getLp((HighsLpRelaxation *)0x601d28);
  HighsSparseVectorSum::setDimension((HighsSparseVectorSum *)pHVar1,dimension);
  return;
}

Assistant:

HighsLpAggregator::HighsLpAggregator(const HighsLpRelaxation& lprelaxation)
    : lprelaxation(lprelaxation) {
  vectorsum.setDimension(lprelaxation.getLp().num_row_ +
                         lprelaxation.getLp().num_col_);
}